

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fc_layer.h
# Opt level: O2

void __thiscall fc_layer_t::calc_grads(fc_layer_t *this,tensor_t<float> *grad_next_layer)

{
  float fVar1;
  pointer pgVar2;
  float *pfVar3;
  int _y;
  int i;
  int _x;
  tensor_t<float> *this_00;
  int n;
  long lVar4;
  int z;
  int _z;
  undefined1 auVar5 [16];
  float fVar6;
  
  this_00 = &(this->super_layer_t).grads_in;
  tensor_t<float>::clear(this_00);
  for (lVar4 = 0; lVar4 < (this->super_layer_t).out.size.x; lVar4 = lVar4 + 1) {
    pgVar2 = (this->gradients).super__Vector_base<gradient_t,_std::allocator<gradient_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    _x = 0;
    pfVar3 = tensor_t<float>::get(grad_next_layer,(int)lVar4,0,0);
    auVar5._8_4_ = 0x80000000;
    auVar5._0_8_ = 0x8000000080000000;
    auVar5._12_4_ = 0x80000000;
    auVar5 = vxorps_avx512vl(ZEXT416((uint)(this->input).
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_start[lVar4]),auVar5);
    fVar6 = expf(auVar5._0_4_);
    fVar6 = 1.0 / (fVar6 + 1.0);
    auVar5 = ZEXT416((uint)(fVar6 * *pfVar3));
    auVar5 = vfnmadd213ss_fma(auVar5,ZEXT416((uint)fVar6),auVar5);
    pgVar2[lVar4].grad = auVar5._0_4_;
    for (; _x < (this->super_layer_t).in.size.x; _x = _x + 1) {
      for (_y = 0; _y < (this->super_layer_t).in.size.y; _y = _y + 1) {
        for (_z = 0; _z < (this->super_layer_t).in.size.z; _z = _z + 1) {
          fVar6 = pgVar2[lVar4].grad;
          pfVar3 = tensor_t<float>::get
                             (&this->weights,
                              ((this->super_layer_t).in.size.y * _z + _y) *
                              (this->super_layer_t).in.size.x + _x,(int)lVar4,0);
          fVar1 = *pfVar3;
          pfVar3 = tensor_t<float>::get(this_00,_x,_y,_z);
          auVar5 = vfmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)fVar6),ZEXT416((uint)*pfVar3))
          ;
          *pfVar3 = auVar5._0_4_;
        }
      }
    }
  }
  return;
}

Assistant:

void calc_grads(tensor_t<float> &grad_next_layer) {
    grads_in.clear();
    for (int n = 0; n < out.size.x; n++) {
      gradient_t &grad = gradients[n];
      grad.grad = grad_next_layer(n, 0, 0) * activator_derivative(input[n]);

      for (int i = 0; i < in.size.x; i++)
        for (int j = 0; j < in.size.y; j++)
          for (int z = 0; z < in.size.z; z++) {
            int m = map({i, j, z});
            grads_in(i, j, z) += grad.grad * weights(m, n, 0);
          }
    }
  }